

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::js::Generator::GenerateEnum
          (Generator *this,GeneratorOptions *options,Printer *printer,EnumDescriptor *enumdesc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *buffer;
  int iVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  EnumValueDescriptor *descriptor;
  pointer piVar5;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  vector<int,_std::allocator<int>_> valid_index;
  string local_e8;
  int *local_c8;
  EnumDescriptor *local_c0;
  char *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  used_name;
  
  (anonymous_namespace)::GetPrefix_abi_cxx11_
            ((string *)&used_name,
             (_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
             (GeneratorOptions *)(options->namespace_prefix)._M_string_length,
             *(FileDescriptor **)(enumdesc + 0x10),*(Descriptor **)(enumdesc + 0x18));
  io::Printer::Print<char[11],std::__cxx11::string,char[5],std::__cxx11::string>
            (printer,"/**\n * @enum {number}\n */\n$enumprefix$$name$ = {\n",
             (char (*) [11])"enumprefix",(string *)&used_name,(char (*) [5])0x3ea8a1,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(enumdesc + 8));
  if ((_Base_ptr *)used_name._M_t._M_impl._0_8_ !=
      &used_name._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)used_name._M_t._M_impl._0_8_);
  }
  io::Printer::Annotate<google::protobuf::EnumDescriptor>(printer,"name","name",enumdesc);
  used_name._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &used_name._M_t._M_impl.super__Rb_tree_header._M_header;
  used_name._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  used_name._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  used_name._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e8._M_dataplus._M_p._0_4_ = 0;
  used_name._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       used_name._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < *(int *)(enumdesc + 4)) {
    do {
      if (*(char *)(*(long *)(enumdesc + 0x20) + 0x48) == '\x01') {
        anon_unknown_0::ToEnumCase
                  (&local_90,
                   *(string **)
                    (*(long *)(enumdesc + 0x28) + 8 + (long)(int)local_e8._M_dataplus._M_p * 0x20));
        pVar6 = std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&used_name,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
        goto LAB_002514c8;
      }
      else {
LAB_002514c8:
        if (valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&valid_index,
                     (iterator)
                     valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_e8);
        }
        else {
          *valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_finish = (int)local_e8._M_dataplus._M_p;
          valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
      }
      local_e8._M_dataplus._M_p._0_4_ = (int)local_e8._M_dataplus._M_p + 1;
    } while ((int)local_e8._M_dataplus._M_p < *(int *)(enumdesc + 4));
    local_c8 = valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    local_c0 = enumdesc;
    if (valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      piVar5 = valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        iVar1 = *piVar5;
        lVar2 = *(long *)(local_c0 + 0x28);
        lVar4 = (long)iVar1 * 0x20;
        anon_unknown_0::ToEnumCase(&local_e8,*(string **)(lVar2 + 8 + lVar4));
        descriptor = (EnumValueDescriptor *)(lVar2 + lVar4);
        buffer = &local_90.field_2;
        local_90._M_dataplus._M_p = (pointer)buffer;
        pcVar3 = FastInt32ToBufferLeft(*(int32 *)(descriptor + 4),buffer->_M_local_buf);
        local_90._M_string_length = (long)pcVar3 - (long)buffer;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,local_90._M_dataplus._M_p,
                   local_90._M_dataplus._M_p + local_90._M_string_length);
        local_b8 = ",";
        if (iVar1 == valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1]) {
          local_b8 = "";
        }
        io::Printer::
        Print<char[5],std::__cxx11::string,char[6],std::__cxx11::string,char[6],char_const*>
                  (printer,"  $name$: $value$$comma$\n",(char (*) [5])0x3ea8a1,&local_e8,
                   (char (*) [6])0x43496c,&local_b0,(char (*) [6])"comma",&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_e8._M_dataplus._M_p._4_4_,(int)local_e8._M_dataplus._M_p) !=
            &local_e8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_e8._M_dataplus._M_p._4_4_,(int)local_e8._M_dataplus._M_p));
        }
        io::Printer::Annotate<google::protobuf::EnumValueDescriptor>
                  (printer,"name","name",descriptor);
        piVar5 = piVar5 + 1;
      } while (piVar5 != local_c8);
    }
  }
  io::Printer::Print<>(printer,"};\n\n");
  if (valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&used_name._M_t);
  return;
}

Assistant:

void Generator::GenerateEnum(const GeneratorOptions& options,
                             io::Printer* printer,
                             const EnumDescriptor* enumdesc) const {
  printer->Print(
      "/**\n"
      " * @enum {number}\n"
      " */\n"
      "$enumprefix$$name$ = {\n",
      "enumprefix", GetEnumPathPrefix(options, enumdesc), "name",
      enumdesc->name());
  printer->Annotate("name", enumdesc);

  std::set<std::string> used_name;
  std::vector<int> valid_index;
  for (int i = 0; i < enumdesc->value_count(); i++) {
    if (enumdesc->options().allow_alias() &&
        !used_name.insert(ToEnumCase(enumdesc->value(i)->name())).second) {
      continue;
    }
    valid_index.push_back(i);
  }
  for (auto i : valid_index) {
    const EnumValueDescriptor* value = enumdesc->value(i);
    printer->Print("  $name$: $value$$comma$\n", "name",
                   ToEnumCase(value->name()), "value", StrCat(value->number()),
                   "comma", (i == valid_index.back()) ? "" : ",");
    printer->Annotate("name", value);
  }

  printer->Print(
      "};\n"
      "\n");
}